

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyPtr.h
# Opt level: O0

CopyPtr<slang::AssociativeArray> * __thiscall
slang::CopyPtr<slang::AssociativeArray>::operator=
          (CopyPtr<slang::AssociativeArray> *this,CopyPtr<slang::AssociativeArray> *other)

{
  AssociativeArray *pAVar1;
  AssociativeArray *in_RSI;
  AssociativeArray *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  AssociativeArray *in_stack_ffffffffffffffe0;
  
  if (in_RDI != in_RSI) {
    pAVar1 = *(AssociativeArray **)
              &(in_RDI->
               super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
               )._M_t._M_impl;
    if (pAVar1 != (AssociativeArray *)0x0) {
      AssociativeArray::~AssociativeArray(pAVar1);
      operator_delete(pAVar1,in_stack_ffffffffffffffc8);
    }
    pAVar1 = (AssociativeArray *)operator_new(0x4f9b65);
    AssociativeArray::AssociativeArray(in_stack_ffffffffffffffe0,in_RDI);
    *(AssociativeArray **)
     &(in_RDI->
      super_map<slang::ConstantValue,_slang::ConstantValue,_std::less<slang::ConstantValue>,_std::allocator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>_>
      )._M_t._M_impl = pAVar1;
  }
  return (CopyPtr<slang::AssociativeArray> *)in_RDI;
}

Assistant:

CopyPtr& operator=(const CopyPtr& other) {
        if (this != &other) {
            delete ptr;
            ptr = new T(*other.ptr);
        }
        return *this;
    }